

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O0

void Cmd_secret(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  level_info_t *plVar6;
  char *local_500;
  char *local_4c0;
  ulong local_4b8;
  size_t ii;
  size_t llen;
  char *ln;
  level_info_t *info;
  FString levelname;
  char local_488 [7];
  bool inlevel;
  char readbuffer [1024];
  FString linebuild;
  FString local_70;
  FString maphdr;
  FWadLump lump;
  int lumpno;
  bool foundsome;
  bool thislevel;
  char *mapname;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 < 2) {
    local_4c0 = FString::GetChars(&level.MapName);
  }
  else {
    local_4c0 = FCommandLine::operator[](argv,1);
  }
  pcVar4 = FString::operator_cast_to_char_(&level.MapName);
  iVar2 = strcasecmp(local_4c0,pcVar4);
  bVar1 = false;
  iVar3 = FWadCollection::CheckNumForName(&Wads,"SECRETS");
  if (-1 < iVar3) {
    FWadCollection::OpenLumpNum((FWadLump *)&maphdr,&Wads,iVar3);
    FString::FString(&local_70);
    FString::Format(&local_70,"[%s]",local_4c0);
    FString::FString((FString *)(readbuffer + 0x3f8));
    levelname.Chars._7_1_ = 0;
    while (pcVar4 = FWadLump::Gets((FWadLump *)&maphdr,local_488,0x400), pcVar4 != (char *)0x0) {
      if ((levelname.Chars._7_1_ & 1) == 0) {
        if (local_488[0] == '[') {
          pcVar4 = FString::operator_cast_to_char_(&local_70);
          sVar5 = FString::Len(&local_70);
          iVar3 = strncasecmp(local_488,pcVar4,sVar5);
          levelname.Chars._7_1_ = (iVar3 != 0 ^ 0xffU) & 1;
          if (!bVar1) {
            FString::FString((FString *)&info);
            plVar6 = FindLevelInfo(local_4c0,true);
            if ((plVar6->flags & 0x4000000) == 0) {
              local_500 = FString::GetChars(&plVar6->LevelName);
            }
            else {
              pcVar4 = FString::GetChars(&plVar6->LevelName);
              local_500 = FStringTable::operator[](&GStrings,pcVar4);
            }
            FString::Format((FString *)&info,"%s - %s\n",local_4c0,local_500);
            sVar5 = FString::Len((FString *)&info);
            for (local_4b8 = 0; local_4b8 < sVar5 - 1; local_4b8 = local_4b8 + 1) {
              FString::operator+=((FString *)&info,'-');
            }
            pcVar4 = FString::GetChars((FString *)&info);
            Printf("\x1cK%s\n",pcVar4);
            bVar1 = true;
            FString::~FString((FString *)&info);
          }
        }
      }
      else if (local_488[0] == '[') {
        levelname.Chars._7_1_ = 0;
      }
      else {
        FString::operator+=((FString *)(readbuffer + 0x3f8),local_488);
        sVar5 = FString::Len((FString *)(readbuffer + 0x3f8));
        if ((sVar5 < 0x3ff) ||
           (pcVar4 = FString::operator[]((FString *)(readbuffer + 0x3f8),0x3fe), *pcVar4 == '\n')) {
          FString::Substitute((FString *)(readbuffer + 0x3f8),"\r","");
          FString::StripRight((FString *)(readbuffer + 0x3f8)," \t\n");
          pcVar4 = FString::operator_cast_to_char_((FString *)(readbuffer + 0x3f8));
          PrintSecretString(pcVar4,(bool)((iVar2 != 0 ^ 0xffU) & 1));
          FString::operator=((FString *)(readbuffer + 0x3f8),"");
        }
      }
    }
    FString::~FString((FString *)(readbuffer + 0x3f8));
    FString::~FString(&local_70);
    FWadLump::~FWadLump((FWadLump *)&maphdr);
  }
  return;
}

Assistant:

CCMD(secret)
{
	const char *mapname = argv.argc() < 2? level.MapName.GetChars() : argv[1];
	bool thislevel = !stricmp(mapname, level.MapName);
	bool foundsome = false;

	int lumpno=Wads.CheckNumForName("SECRETS");
	if (lumpno < 0) return;

	FWadLump lump = Wads.OpenLumpNum(lumpno);
	FString maphdr;
	maphdr.Format("[%s]", mapname);

	FString linebuild;
	char readbuffer[1024];
	bool inlevel = false;

	while (lump.Gets(readbuffer, 1024))
	{
		if (!inlevel)
		{
			if (readbuffer[0] == '[')
			{
				inlevel = !strnicmp(readbuffer, maphdr, maphdr.Len());
				if (!foundsome)
				{
					FString levelname;
					level_info_t *info = FindLevelInfo(mapname);
					const char *ln = !(info->flags & LEVEL_LOOKUPLEVELNAME)? info->LevelName.GetChars() : GStrings[info->LevelName.GetChars()];
					levelname.Format("%s - %s\n", mapname, ln);
					size_t llen = levelname.Len() - 1;
					for(size_t ii=0; ii<llen; ii++) levelname += '-';
					Printf(TEXTCOLOR_YELLOW"%s\n", levelname.GetChars());
					foundsome = true;
				}
			}
			continue;
		}
		else
		{
			if (readbuffer[0] != '[')
			{
				linebuild += readbuffer;
				if (linebuild.Len() < 1023 || linebuild[1022] == '\n')
				{
					// line complete so print it.
					linebuild.Substitute("\r", "");
					linebuild.StripRight(" \t\n");
					PrintSecretString(linebuild, thislevel);
					linebuild = "";
				}
			}
			else inlevel = false;
		}
	}
}